

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_free.c
# Opt level: O0

int main(void)

{
  void *__ptr;
  _Bool error;
  char *buffer;
  
  __ptr = malloc(0x100);
  free(__ptr);
  free(__ptr);
  return 0;
}

Assistant:

int main() {
  char* buffer = (char*)malloc (256);
  bool error = true;

  if (error)
    free(buffer);

  // [...]

  free(buffer); // second free
}